

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O2

void __thiscall
duckdb::ConflictManager::ConflictManager
          (ConflictManager *this,VerifyExistenceType lookup_type,idx_t input_size,
          optional_ptr<duckdb::ConflictInfo,_true> conflict_info)

{
  this->lookup_type = lookup_type;
  this->input_size = input_size;
  (this->conflict_info).ptr = conflict_info.ptr;
  this->finalized = false;
  ManagedSelection::ManagedSelection(&this->conflicts,input_size,false);
  (this->row_id_map).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->row_id_map).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->intermediate_vector).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
  ._M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  (this->row_id_map).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->row_ids).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  (this->conflict_set).
  super_unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_t.
  super___uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  ._M_head_impl =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)0x0;
  this->single_index_finished = false;
  this->mode = THROW;
  (this->matched_indexes).
  super_vector<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->matched_indexes).
  super_vector<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->matched_indexes).
  super_vector<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->matched_delete_indexes).
  super_vector<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->matched_delete_indexes).
  super_vector<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->matched_delete_indexes).
  super_vector<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->matched_index_names)._M_h._M_buckets = &(this->matched_index_names)._M_h._M_single_bucket;
  (this->matched_index_names)._M_h._M_bucket_count = 1;
  (this->matched_index_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->matched_index_names)._M_h._M_element_count = 0;
  (this->matched_index_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->matched_index_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->matched_index_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

ConflictManager::ConflictManager(VerifyExistenceType lookup_type, idx_t input_size,
                                 optional_ptr<ConflictInfo> conflict_info)
    : lookup_type(lookup_type), input_size(input_size), conflict_info(conflict_info), conflicts(input_size, false),
      mode(ConflictManagerMode::THROW) {
}